

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

void __thiscall S2Builder::Graph::VertexInMap::Init(VertexInMap *this,Graph *g)

{
  pointer piVar1;
  pointer ppVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  EdgeId e;
  vector<int,_std::allocator<int>_> local_48;
  
  GetInEdgeIds(&local_48,g);
  piVar1 = (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
  (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->in_edge_begins_,(long)g->num_vertices_ + 1)
  ;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  if (-1 < g->num_vertices_) {
    iVar8 = 0;
    do {
      ppVar2 = (g->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar6 = (int)((ulong)((long)(g->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3);
      iVar5 = (int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if ((int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start < iVar6) {
        piVar7 = (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 (int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        iVar4 = (int)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        do {
          iVar5 = iVar4;
          if (iVar8 <= ppVar2[*piVar7].second) break;
          iVar4 = iVar4 + 1;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
          piVar7 = piVar7 + 1;
          iVar5 = iVar6;
        } while (iVar6 != iVar4);
      }
      __position._M_current =
           (this->in_edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->in_edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->in_edge_begins_,__position,
                   (int *)&local_48);
      }
      else {
        *__position._M_current = iVar5;
        (this->in_edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar3 = iVar8 < g->num_vertices_;
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Graph::VertexInMap::Init(const Graph& g) {
  in_edge_ids_ = g.GetInEdgeIds();
  in_edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(in_edge_ids_[e]).second < v) ++e;
    in_edge_begins_.push_back(e);
  }
}